

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,JSON *other)

{
  double dVar1;
  char *pcVar2;
  char *pcVar3;
  variant_alternative_t<2UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *pvVar4;
  variant_alternative_t<3UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *pvVar5;
  add_pointer_t<const_variant_alternative_t<1UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  ptVar6;
  add_pointer_t<const_variant_alternative_t<2UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  ptVar7;
  add_pointer_t<const_variant_alternative_t<3UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  ptVar8;
  add_pointer_t<const_variant_alternative_t<4UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  v;
  add_pointer_t<const_variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  v_00;
  add_pointer_t<const_variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  v_01;
  logic_error *this_00;
  int in_EDX;
  int __c;
  JSON *__s;
  double dVar9;
  char local_a9;
  char local_93;
  char local_91;
  char local_79;
  dict_type *other_v_3;
  list_type *other_v_2;
  string *other_v_1;
  double *other_vf;
  int64_t *other_vi;
  bool *other_v;
  size_t other_index;
  size_t this_index;
  JSON *other_local;
  JSON *this_local;
  
  __s = other;
  pcVar2 = ::std::
           variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           ::index(&this->value,(char *)other,in_EDX);
  pcVar3 = ::std::
           variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           ::index(&other->value,(char *)__s,__c);
  if ((pcVar2 == (char *)0x2) && (pcVar3 == (char *)0x3)) {
    pvVar4 = ::std::
             get<2ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&this->value);
    dVar9 = (double)*pvVar4;
    pvVar5 = ::std::
             get<3ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&other->value);
    dVar1 = *pvVar5;
    local_79 = '\x01';
    if (dVar9 <= dVar1) {
      local_79 = (dVar9 != dVar1) * '\x02';
    }
    local_91 = -1;
    if (dVar1 <= dVar9) {
      local_91 = local_79;
    }
    this_local._7_1_ = local_91;
  }
  else if ((pcVar2 == (char *)0x3) && (pcVar3 == (char *)0x2)) {
    pvVar5 = ::std::
             get<3ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&this->value);
    dVar1 = *pvVar5;
    pvVar4 = ::std::
             get<2ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&other->value);
    dVar9 = (double)*pvVar4;
    local_93 = '\x01';
    if (dVar1 <= dVar9) {
      local_93 = (dVar9 != dVar1) * '\x02';
    }
    local_a9 = -1;
    if (dVar9 <= dVar1) {
      local_a9 = local_93;
    }
    this_local._7_1_ = local_a9;
  }
  else if (pcVar2 == pcVar3) {
    switch(pcVar2) {
    case (char *)0x0:
      this_local._7_1_ = '\0';
      break;
    case (char *)0x1:
      ptVar6 = ::std::
               get_if<1ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                         (&other->value);
      if (ptVar6 == (add_pointer_t<const_variant_alternative_t<1UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                     )0x0) {
        this_local._7_1_ = '\x02';
      }
      else {
        this_local._7_1_ = operator<=>(this,(bool)(*ptVar6 & 1));
      }
      break;
    case (char *)0x2:
    case (char *)0x3:
      ptVar7 = ::std::
               get_if<2ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                         (&other->value);
      if (ptVar7 == (add_pointer_t<const_variant_alternative_t<2UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                     )0x0) {
        ptVar8 = ::std::
                 get_if<3ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                           (&other->value);
        if (ptVar8 == (add_pointer_t<const_variant_alternative_t<3UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                       )0x0) {
          this_local._7_1_ = '\x02';
        }
        else {
          this_local._7_1_ = operator<=><double>(this,*ptVar8);
        }
      }
      else {
        this_local._7_1_ = operator<=><long>(this,*ptVar7);
      }
      break;
    case (char *)0x4:
      v = ::std::
          get_if<4ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                    (&other->value);
      if (v == (add_pointer_t<const_variant_alternative_t<4UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                )0x0) {
        this_local._7_1_ = '\x02';
      }
      else {
        this_local._7_1_ = operator<=>(this,v);
      }
      break;
    case (char *)0x5:
      v_00 = ::std::
             get_if<5ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&other->value);
      if (v_00 == (add_pointer_t<const_variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                   )0x0) {
        this_local._7_1_ = '\x02';
      }
      else {
        this_local._7_1_ = operator<=>(this,v_00);
      }
      break;
    case (char *)0x6:
      v_01 = ::std::
             get_if<6ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                       (&other->value);
      if (v_01 == (add_pointer_t<const_variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
                   )0x0) {
        this_local._7_1_ = '\x02';
      }
      else {
        this_local._7_1_ = operator<=>(this,v_01);
      }
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      ::std::logic_error::logic_error(this_00,"invalid JSON value type");
      __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
    }
  }
  else {
    this_local._7_1_ = '\x02';
  }
  return (partial_ordering)this_local._7_1_;
}

Assistant:

partial_ordering JSON::operator<=>(const JSON& other) const {
  size_t this_index = this->value.index();
  size_t other_index = other.value.index();

  // Allow cross-type int/float comparisons
  if (this_index == 2 && other_index == 3) {
    return ::get<2>(this->value) <=> ::get<3>(other.value);
  } else if (this_index == 3 && other_index == 2) {
    return ::get<3>(this->value) <=> ::get<2>(other.value);
  }

  if (this_index != other_index) {
    return partial_ordering::unordered;
  }
  switch (this_index) {
    case 0:
      return partial_ordering::equivalent;
    case 1: {
      const bool* other_v = ::get_if<1>(&other.value);
      return (other_v == nullptr ? partial_ordering::unordered : this->operator<=>(*other_v));
    }
    case 2:
    case 3: {
      const int64_t* other_vi = ::get_if<2>(&other.value);
      if (other_vi) {
        return this->operator<=>(*other_vi);
      }
      const double* other_vf = ::get_if<3>(&other.value);
      return (other_vf == nullptr ? partial_ordering::unordered : this->operator<=>(*other_vf));
    }
    case 4: {
      const string* other_v = ::get_if<4>(&other.value);
      return (other_v == nullptr ? partial_ordering::unordered : this->operator<=>(*other_v));
    }
    case 5: {
      const list_type* other_v = ::get_if<5>(&other.value);
      return (other_v == nullptr ? partial_ordering::unordered : this->operator<=>(*other_v));
    }
    case 6: {
      const dict_type* other_v = ::get_if<6>(&other.value);
      return (other_v == nullptr ? partial_ordering::unordered : this->operator<=>(*other_v));
    }
    default:
      throw logic_error("invalid JSON value type");
  }
}